

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Scale s)

{
  Syntax SVar1;
  char *pcVar2;
  StrWriter *this_local;
  Scale s_local;
  
  if (s.raw == 0) {
    return this;
  }
  SVar1 = this->style->syntax;
  if (SVar1 != MOIRA) {
    if (SVar1 == MOIRA_MIT) {
LAB_0013824c:
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = ':';
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = (char)(1 << ((byte)s.raw & 0x1f)) + '0';
      return this;
    }
    if (SVar1 != GNU) {
      if (SVar1 == GNU_MIT) goto LAB_0013824c;
      if (SVar1 != MUSASHI) {
        return this;
      }
    }
  }
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = '*';
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (char)(1 << ((byte)s.raw & 0x1f)) + '0';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Scale s)
{
    if (!s.raw) return *this;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:
       case Syntax::GNU:

            *ptr++ = '*';
            *ptr++ = '0' + (char)(1 << s.raw);
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *ptr++ = ':';
            *ptr++ = '0' + (char)(1 << s.raw);
            break;
    }

    return *this;
}